

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

istream * Json::operator>>(istream *sin,Value *root)

{
  bool bVar1;
  Reader reader;
  string local_120;
  Reader local_100;
  
  Reader::Reader(&local_100);
  bVar1 = Reader::parse(&local_100,sin,root);
  if (bVar1) {
    Reader::~Reader(&local_100);
    return sin;
  }
  Reader::getFormatedErrorMessages_abi_cxx11_(&local_120,&local_100);
  jbcoin::Throw<std::runtime_error,std::__cxx11::string>(&local_120);
}

Assistant:

std::istream& operator>> ( std::istream& sin, Value& root )
{
    Json::Reader reader;
    bool ok = reader.parse (sin, root);

    //JSON_ASSERT( ok );
    if (! ok)
        jbcoin::Throw<std::runtime_error> (reader.getFormatedErrorMessages ());

    return sin;
}